

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O2

cs_err cs_option(csh ud,cs_opt_type type,size_t value)

{
  int iVar1;
  undefined8 uVar2;
  char cVar3;
  cs_err cVar4;
  ulong uVar5;
  undefined4 *puVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  cs_opt_mem *mem;
  
  if (type == CS_OPT_MEM) {
    cs_mem_malloc = *(cs_malloc_t *)value;
    cs_mem_calloc = *(cs_calloc_t *)(value + 8);
    cs_mem_realloc = *(cs_realloc_t *)(value + 0x10);
    cs_mem_free = *(cs_free_t *)(value + 0x18);
    cs_vsnprintf = *(cs_vsnprintf_t *)(value + 0x20);
    goto LAB_001bb989;
  }
  if (ud == 0) {
    return CS_ERR_CSH;
  }
  switch(type) {
  case CS_OPT_DETAIL:
    *(int *)(ud + 0x60) = (int)value;
    goto LAB_001bb989;
  case CS_OPT_MODE:
    uVar5 = (ulong)*(uint *)ud;
    if (((long)cs_arch_disallowed_mode_mask[uVar5] & value) == 0) goto LAB_001bba24;
    cVar4 = CS_ERR_OPTION;
    break;
  default:
    uVar5 = (ulong)*(uint *)ud;
LAB_001bba24:
    cVar4 = (*cs_arch_option[uVar5])((cs_struct *)ud,type,value);
    return cVar4;
  case CS_OPT_SKIPDATA:
    cVar4 = CS_ERR_OK;
    *(bool *)(ud + 0x80) = value == 3;
    if ((value == 3) && (*(char *)(ud + 0x81) == '\0')) {
      switch(*(undefined4 *)ud) {
      case 0:
        cVar3 = ((*(byte *)(ud + 4) & 0x10) == 0) * '\x02' + '\x02';
        break;
      case 1:
      case 2:
      case 4:
      case 5:
      case 9:
        cVar3 = '\x04';
        break;
      case 3:
      case 10:
      case 0xb:
      case 0xc:
        cVar3 = '\x01';
        break;
      case 6:
      case 7:
      case 8:
        cVar3 = '\x02';
        break;
      default:
        cVar3 = -1;
      }
      *(char *)(ud + 0x81) = cVar3;
    }
    break;
  case CS_OPT_SKIPDATA_SETUP:
    cVar4 = CS_ERR_OK;
    if (value != 0) {
      *(undefined8 *)(ud + 0x98) = *(undefined8 *)(value + 0x10);
      uVar2 = *(undefined8 *)(value + 8);
      *(undefined8 *)(ud + 0x88) = *(undefined8 *)value;
      *(undefined8 *)(ud + 0x90) = uVar2;
    }
    break;
  case CS_OPT_MNEMONIC:
    iVar1 = *(int *)value;
    cVar4 = CS_ERR_OK;
    if (iVar1 != 0) {
      piVar10 = (int *)(ud + 0xb0);
      piVar8 = piVar10;
      if (*(char **)(value + 8) == (char *)0x0) {
        piVar8 = *(int **)piVar10;
        for (piVar9 = *(int **)piVar10; piVar9 != (int *)0x0; piVar9 = *(int **)(piVar9 + 10)) {
          if (*piVar9 == iVar1) {
            piVar7 = piVar8 + 10;
            if (piVar9 == piVar8) {
              piVar7 = piVar10;
            }
            *(undefined8 *)piVar7 = *(undefined8 *)(piVar9 + 10);
            (*cs_mem_free)(piVar9);
            return CS_ERR_OK;
          }
          piVar8 = piVar9;
        }
      }
      else {
        for (; piVar8 = *(int **)piVar8, piVar8 != (int *)0x0; piVar8 = piVar8 + 10) {
          if (*piVar8 == iVar1) {
            strncpy((char *)(piVar8 + 1),*(char **)(value + 8),0x1f);
            *(undefined1 *)((long)piVar8 + 0x23) = 0;
            return CS_ERR_OK;
          }
        }
        puVar6 = (undefined4 *)(*cs_mem_malloc)(0x30);
        *puVar6 = *(undefined4 *)value;
        strncpy((char *)(puVar6 + 1),*(char **)(value + 8),0x1f);
        *(undefined1 *)((long)puVar6 + 0x23) = 0;
        *(undefined8 *)(puVar6 + 10) = *(undefined8 *)piVar10;
        *(undefined4 **)piVar10 = puVar6;
      }
    }
    break;
  case CS_OPT_UNSIGNED:
    *(int *)(ud + 100) = (int)value;
LAB_001bb989:
    cVar4 = CS_ERR_OK;
  }
  return cVar4;
}

Assistant:

CAPSTONE_API cs_option(csh ud, cs_opt_type type, size_t value)
{
	struct cs_struct *handle;
	cs_opt_mnem *opt;

	// cs_option() can be called with NULL handle just for CS_OPT_MEM
	// This is supposed to be executed before all other APIs (even cs_open())
	if (type == CS_OPT_MEM) {
		cs_opt_mem *mem = (cs_opt_mem *)value;

		cs_mem_malloc = mem->malloc;
		cs_mem_calloc = mem->calloc;
		cs_mem_realloc = mem->realloc;
		cs_mem_free = mem->free;
		cs_vsnprintf = mem->vsnprintf;

		return CS_ERR_OK;
	}

	handle = (struct cs_struct *)(uintptr_t)ud;
	if (!handle)
		return CS_ERR_CSH;

	switch(type) {
		default:
			break;

		case CS_OPT_UNSIGNED:
			handle->imm_unsigned = (cs_opt_value)value;
			return CS_ERR_OK;

		case CS_OPT_DETAIL:
			handle->detail = (cs_opt_value)value;
			return CS_ERR_OK;

		case CS_OPT_SKIPDATA:
			handle->skipdata = (value == CS_OPT_ON);
			if (handle->skipdata) {
				if (handle->skipdata_size == 0) {
					// set the default skipdata size
					handle->skipdata_size = skipdata_size(handle);
				}
			}
			return CS_ERR_OK;

		case CS_OPT_SKIPDATA_SETUP:
			if (value)
				handle->skipdata_setup = *((cs_opt_skipdata *)value);
			return CS_ERR_OK;

		case CS_OPT_MNEMONIC:
			opt = (cs_opt_mnem *)value;
			if (opt->id) {
				if (opt->mnemonic) {
					struct insn_mnem *tmp;

					// add new instruction, or replace existing instruction
					// 1. find if we already had this insn in the linked list
					tmp = handle->mnem_list;
					while(tmp) {
						if (tmp->insn.id == opt->id) {
							// found this instruction, so replace its mnemonic
							(void)strncpy(tmp->insn.mnemonic, opt->mnemonic, sizeof(tmp->insn.mnemonic) - 1);
							tmp->insn.mnemonic[sizeof(tmp->insn.mnemonic) - 1] = '\0';
							break;
						}
						tmp = tmp->next;
					}

					// 2. add this instruction if we have not had it yet
					if (!tmp) {
						tmp = cs_mem_malloc(sizeof(*tmp));
						tmp->insn.id = opt->id;
						(void)strncpy(tmp->insn.mnemonic, opt->mnemonic, sizeof(tmp->insn.mnemonic) - 1);
						tmp->insn.mnemonic[sizeof(tmp->insn.mnemonic) - 1] = '\0';
						// this new instruction is heading the list
						tmp->next = handle->mnem_list;
						handle->mnem_list = tmp;
					}
					return CS_ERR_OK;
				} else {
					struct insn_mnem *prev, *tmp;

					// we want to delete an existing instruction
					// iterate the list to find the instruction to remove it
					tmp = handle->mnem_list;
					prev = tmp;
					while(tmp) {
						if (tmp->insn.id == opt->id) {
							// delete this instruction
							if (tmp == prev) {
								// head of the list
								handle->mnem_list = tmp->next;
							} else {
								prev->next = tmp->next;
							}
							cs_mem_free(tmp);
							break;
						}
						prev = tmp;
						tmp = tmp->next;
					}
				}
			}
			return CS_ERR_OK;

		case CS_OPT_MODE:
			// verify if requested mode is valid
			if (value & cs_arch_disallowed_mode_mask[handle->arch]) {
				return CS_ERR_OPTION;
			}
			break;
	}

	return cs_arch_option[handle->arch](handle, type, value);
}